

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinter.cpp
# Opt level: O3

void return_10_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  long *plVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Value AVar3;
  Am_Object window;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Value local_18;
  
  local_30.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object((ushort)&local_20,(ulong)self);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_20,0x68);
  Am_Object::operator=(&local_30,pAVar1);
  Am_Object::~Am_Object(&local_20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calling Finish_Pop_Up_Waiting on ",0x21);
  plVar2 = (long *)operator<<((ostream *)&std::cout,&local_30);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Am_Object(&local_28,&local_30);
  local_18.type = 2;
  local_18.value.long_value = 10;
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = &local_18;
  Am_Finish_Pop_Up_Waiting((Am_Object_Data *)&local_28,AVar3);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, return_10, (Am_Object self))
{
  Am_Object window;
  window = self.Get_Object(Am_SAVED_OLD_OWNER).Get(Am_WINDOW);
  cout << "Calling Finish_Pop_Up_Waiting on " << window << endl << flush;
  Am_Finish_Pop_Up_Waiting(window, 10);
}